

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReorderFunctions.cpp
# Opt level: O1

Pass * wasm::createReorderFunctionsPass(void)

{
  Pass *pPVar1;
  
  pPVar1 = (Pass *)operator_new(0x30);
  pPVar1->_vptr_Pass = (_func_int **)0x0;
  pPVar1->runner = (PassRunner *)0x0;
  (pPVar1->name)._M_dataplus._M_p = (pointer)0x0;
  (pPVar1->name)._M_string_length = 0;
  (pPVar1->name).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(pPVar1->name).field_2 + 8) = 0;
  pPVar1->runner = (PassRunner *)0x0;
  (pPVar1->name)._M_dataplus._M_p = (pointer)&(pPVar1->name).field_2;
  (pPVar1->name)._M_string_length = 0;
  (pPVar1->name).field_2._M_local_buf[0] = '\0';
  pPVar1->_vptr_Pass = (_func_int **)&PTR__Pass_00d8a9f8;
  return pPVar1;
}

Assistant:

Pass* createReorderFunctionsPass() { return new ReorderFunctions(); }